

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O2

QHash<QByteArray,_QByteArray>
QAuthenticatorPrivate::parseDigestAuthenticationChallenge(QByteArrayView challenge)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  byte bVar4;
  char *pcVar5;
  QStringTokenizerBase<QLatin1String,_QChar> *pQVar6;
  char *pcVar7;
  bool bVar8;
  byte *pbVar9;
  QByteArray *pQVar10;
  QHash<QByteArray,_QByteArray> QVar11;
  byte *in_RDX;
  byte *pbVar12;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_d8;
  QHash<QByteArray,_QByteArray> local_c0;
  QLatin1StringView local_b8;
  QLatin1StringView local_a8;
  iterator __begin1;
  QStringTokenizerBase<QLatin1String,_QChar> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_c0.d = (Data *)0x0;
  pbVar1 = in_RDX + (long)challenge.m_data;
  pbVar2 = in_RDX + (long)challenge.m_data;
  while (pbVar9 = in_RDX, in_RDX < pbVar1) {
    while (((pbVar9 = pbVar9 + 1, in_RDX < pbVar1 && ((ulong)*in_RDX < 0x21)) &&
           ((0x100002400U >> ((ulong)*in_RDX & 0x3f) & 1) != 0))) {
      in_RDX = in_RDX + 1;
    }
    local_d8.d = (Data *)0x0;
    for (; (pbVar9 + -1 < pbVar1 && (pbVar9[-1] != 0x3d)); pbVar9 = pbVar9 + 1) {
      local_d8.d = (Data *)((long)&((local_d8.d)->super_QArrayData).ref_._q_value.
                                   super___atomic_base<int>._M_i + 1);
    }
    if (pbVar1 <= pbVar9) break;
    bVar3 = *pbVar9;
    pbVar12 = pbVar9 + 1;
    if (bVar3 != 0x22) {
      pbVar12 = pbVar9;
    }
    if (pbVar1 <= pbVar12) break;
    __begin1.tokenizer = (QStringTokenizerBase<QLatin1String,_QChar> *)0x0;
    __begin1.current.value.m_size = 0;
    __begin1.current.value.m_data = (char *)0x0;
    local_d8.ptr = (char *)in_RDX;
    for (; pbVar12 < pbVar1; pbVar12 = pbVar12 + (ulong)(pbVar12 < pbVar2 + -1 && bVar4 == 0x5c) + 1
        ) {
      bVar4 = *pbVar12;
      if (pbVar12 >= pbVar2 + -1 || bVar4 != 0x5c) {
        if (bVar3 == 0x22) {
          if (bVar4 == 0x22) break;
        }
        else if (bVar4 == 0x2c) break;
      }
      QByteArray::append((char)&__begin1);
    }
    for (; (pbVar12 < pbVar1 && (*pbVar12 != 0x2c)); pbVar12 = pbVar12 + 1) {
    }
    QByteArrayView::toByteArray((QByteArray *)&local_58,(QByteArrayView *)&local_d8);
    pQVar10 = QHash<QByteArray,_QByteArray>::operator[](&local_c0,(QByteArray *)&local_58);
    pQVar6 = (QStringTokenizerBase<QLatin1String,_QChar> *)(pQVar10->d).d;
    pcVar7 = (pQVar10->d).ptr;
    (pQVar10->d).d = (Data *)__begin1.tokenizer;
    (pQVar10->d).ptr = (char *)__begin1.current.value.m_size;
    pcVar5 = (char *)(pQVar10->d).size;
    (pQVar10->d).size = (qsizetype)__begin1.current.value.m_data;
    __begin1.tokenizer = pQVar6;
    __begin1.current.value.m_size = (qsizetype)pcVar7;
    __begin1.current.value.m_data = pcVar5;
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&__begin1);
    in_RDX = pbVar12 + 1;
  }
  local_d8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)&__begin1,"qop",-1);
  QHash<QByteArray,_QByteArray>::value((QByteArray *)&local_d8,&local_c0,(QByteArray *)&__begin1);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&__begin1);
  if ((undefined1 *)local_d8.size == (undefined1 *)0x0) {
LAB_00199e00:
    QVar11.d = local_c0.d;
    local_c0.d = (Data *)0x0;
  }
  else {
    local_58.super_QStringTokenizerBaseBase.m_sb.
    super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.super_QFlagsStorage<Qt::SplitBehaviorFlags>
    .i = (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x0;
    local_58.super_QStringTokenizerBaseBase.m_cs = CaseSensitive;
    local_58.m_haystack.m_size = local_d8.size;
    local_58.m_haystack.m_data = local_d8.ptr;
    local_58.m_needle.ucs = L',';
    __begin1.current.state.extra = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    __begin1.current.state.start = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    __begin1.current.state.end = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    __begin1.current.value.m_data = &DAT_aaaaaaaaaaaaaaaa;
    __begin1.current._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    __begin1.tokenizer = (QStringTokenizerBase<QLatin1String,_QChar> *)&DAT_aaaaaaaaaaaaaaaa;
    __begin1.current.value.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QStringTokenizerBase<QLatin1String,_QChar>::iterator::iterator(&__begin1,&local_58);
    while (__begin1.current.ok == true) {
      local_a8.m_size = __begin1.current.value.m_size;
      local_a8.m_data = __begin1.current.value.m_data;
      local_b8.m_size = 4;
      local_b8.m_data = "auth";
      bVar8 = comparesEqual(&local_a8,&local_b8);
      if (bVar8) {
        QByteArray::QByteArray((QByteArray *)&__begin1,"qop",-1);
        pQVar10 = QHash<QByteArray,_QByteArray>::operator[](&local_c0,(QByteArray *)&__begin1);
        QByteArray::operator=(pQVar10,"auth");
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&__begin1);
        goto LAB_00199e00;
      }
      QStringTokenizerBase<QLatin1String,_QChar>::iterator::advance(&__begin1);
    }
    QVar11.d = (Data *)0x0;
  }
  *(Data **)challenge.m_size = QVar11.d;
  QArrayDataPointer<char>::~QArrayDataPointer(&local_d8);
  QHash<QByteArray,_QByteArray>::~QHash(&local_c0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QHash<QByteArray,_QByteArray>)(Data *)challenge.m_size;
}

Assistant:

QHash<QByteArray, QByteArray>
QAuthenticatorPrivate::parseDigestAuthenticationChallenge(QByteArrayView challenge)
{
    QHash<QByteArray, QByteArray> options;
    // parse the challenge
    const char *d = challenge.data();
    const char *end = d + challenge.size();
    while (d < end) {
        while (d < end && (*d == ' ' || *d == '\n' || *d == '\r'))
            ++d;
        const char *start = d;
        while (d < end && *d != '=')
            ++d;
        QByteArrayView key = QByteArrayView(start, d - start);
        ++d;
        if (d >= end)
            break;
        bool quote = (*d == '"');
        if (quote)
            ++d;
        if (d >= end)
            break;
        QByteArray value;
        while (d < end) {
            bool backslash = false;
            if (*d == '\\' && d < end - 1) {
                ++d;
                backslash = true;
            }
            if (!backslash) {
                if (quote) {
                    if (*d == '"')
                        break;
                } else {
                    if (*d == ',')
                        break;
                }
            }
            value += *d;
            ++d;
        }
        while (d < end && *d != ',')
            ++d;
        ++d;
        options[key.toByteArray()] = std::move(value);
    }

    QByteArray qop = options.value("qop");
    if (!qop.isEmpty()) {
        if (!containsAuth(qop))
            return QHash<QByteArray, QByteArray>();
        // #### can't do auth-int currently
//         if (qop.contains("auth-int"))
//             qop = "auth-int";
//         else if (qop.contains("auth"))
//             qop = "auth";
//         else
//             qop = QByteArray();
        options["qop"] = "auth";
    }

    return options;
}